

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImGuiItemStatusFlags *pIVar2;
  float *pfVar3;
  ImRect *pIVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  ImGuiWindow *pIVar8;
  ImGuiWindow *pIVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  bool bVar14;
  ImGuiID IVar15;
  value_type_conflict3 *pvVar16;
  uint uVar17;
  long lVar18;
  ImGuiContext *g;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar11 = GImGui;
  pIVar8 = GImGui->CurrentWindow;
  if (id == 0) goto LAB_00154b54;
  piVar1 = &(pIVar8->DC).NavLayerActiveMaskNext;
  *piVar1 = *piVar1 | (pIVar8->DC).NavLayerCurrentMask;
  IVar15 = pIVar11->NavId;
  if ((((IVar15 != id) && (pIVar11->NavAnyRequest != true)) ||
      (pIVar9 = pIVar11->NavWindow, pIVar9->RootWindowForNav != pIVar8->RootWindowForNav)) ||
     ((pIVar8 != pIVar9 && (((uint)(pIVar9->Flags | pIVar8->Flags) >> 0x17 & 1) == 0))))
  goto LAB_00154b54;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar6 = (pIVar8->DC).ItemFlags;
  fVar22 = (pIVar8->Pos).x;
  fVar31 = (nav_bb_arg->Min).x - fVar22;
  fVar23 = (pIVar8->Pos).y;
  fVar32 = (nav_bb_arg->Min).y - fVar23;
  fVar22 = (nav_bb_arg->Max).x - fVar22;
  fVar23 = (nav_bb_arg->Max).y - fVar23;
  if ((pIVar11->NavInitRequest == true) && (pIVar11->NavLayer == (pIVar8->DC).NavLayerCurrent)) {
    if ((uVar6 & 0x10) == 0) {
      pIVar11->NavInitResultId = id;
      (pIVar11->NavInitResultRectRel).Min.x = fVar31;
      (pIVar11->NavInitResultRectRel).Min.y = fVar32;
      (pIVar11->NavInitResultRectRel).Max.x = fVar22;
      (pIVar11->NavInitResultRectRel).Max.y = fVar23;
      pIVar11->NavInitRequest = false;
      NavUpdateAnyRequestFlag();
      IVar15 = pIVar11->NavId;
    }
    else if (pIVar11->NavInitResultId == 0) {
      pIVar11->NavInitResultId = id;
      (pIVar11->NavInitResultRectRel).Min.x = fVar31;
      (pIVar11->NavInitResultRectRel).Min.y = fVar32;
      (pIVar11->NavInitResultRectRel).Max.x = fVar22;
      (pIVar11->NavInitResultRectRel).Max.y = fVar23;
    }
  }
  pIVar12 = GImGui;
  if ((IVar15 != id) && ((uVar6 & 8) == 0)) {
    lVar19 = 0x1b28;
    if (pIVar11->NavWindow == pIVar8) {
      lVar19 = 0x1af8;
    }
    if (pIVar11->NavMoveRequest == true) {
      pIVar9 = GImGui->CurrentWindow;
      iVar7 = GImGui->NavLayer;
      if (iVar7 == (pIVar9->DC).NavLayerCurrent) {
        fVar21 = (nav_bb_arg->Min).x;
        fVar20 = (nav_bb_arg->Min).y;
        local_48 = nav_bb_arg->Max;
        GImGui->NavScoringCount = GImGui->NavScoringCount + 1;
        uVar6 = pIVar12->NavMoveDir;
        if (uVar6 < 2) {
          fVar27 = (pIVar9->ClipRect).Min.y;
          fVar28 = (pIVar9->ClipRect).Max.y;
          fVar24 = fVar28;
          if (fVar20 <= fVar28) {
            fVar24 = fVar20;
          }
          fVar20 = (float)(-(uint)(fVar20 < fVar27) & (uint)fVar27 |
                          ~-(uint)(fVar20 < fVar27) & (uint)fVar24);
          lVar18 = 1;
        }
        else {
          fVar27 = (pIVar9->ClipRect).Min.x;
          fVar28 = (pIVar9->ClipRect).Max.x;
          fVar24 = fVar28;
          if (fVar21 <= fVar28) {
            fVar24 = fVar21;
          }
          fVar21 = (float)(-(uint)(fVar21 < fVar27) & (uint)fVar27 |
                          ~-(uint)(fVar21 < fVar27) & (uint)fVar24);
          lVar18 = 0;
        }
        uStack_40 = 0;
        fVar24 = (&local_48.x)[lVar18];
        if (fVar24 <= fVar28) {
          fVar28 = fVar24;
        }
        (&local_48.x)[lVar18] =
             (float)(-(uint)(fVar24 < fVar27) & (uint)fVar27 |
                    ~-(uint)(fVar24 < fVar27) & (uint)fVar28);
        fVar27 = (pIVar12->NavScoringRectScreen).Min.x;
        fVar28 = (pIVar12->NavScoringRectScreen).Max.x;
        if (fVar27 <= local_48.x) {
          fVar24 = 0.0;
          if (fVar28 < fVar21) {
            fVar24 = fVar21 - fVar28;
          }
        }
        else {
          fVar24 = local_48.x - fVar27;
        }
        fVar25 = (local_48.y - fVar20) * 0.8 + fVar20;
        fVar26 = (pIVar12->NavScoringRectScreen).Min.y;
        fVar5 = (pIVar12->NavScoringRectScreen).Max.y;
        fVar29 = fVar5 - fVar26;
        fVar30 = fVar29 * 0.2 + fVar26;
        if (fVar30 <= fVar25) {
          fVar25 = (local_48.y - fVar20) * 0.2 + fVar20;
          fVar29 = fVar29 * 0.8 + fVar26;
          if (fVar29 < fVar25) {
            fVar25 = fVar25 - fVar29;
            goto LAB_00154e32;
          }
          fVar25 = 0.0;
          bVar13 = false;
        }
        else {
          fVar25 = fVar25 - fVar30;
LAB_00154e32:
          bVar13 = fVar25 != 0.0;
          if (((fVar24 != 0.0) || (NAN(fVar24))) && ((fVar25 != 0.0 || (NAN(fVar25))))) {
            fVar24 = fVar24 / 1000.0 + *(float *)(&DAT_001a7cc0 + (ulong)(0.0 < fVar24) * 4);
            bVar13 = true;
          }
        }
        fVar21 = (fVar21 + local_48.x) - (fVar27 + fVar28);
        fVar20 = (fVar20 + local_48.y) - (fVar26 + fVar5);
        fVar27 = ABS(fVar25) + ABS(fVar24);
        fVar28 = ABS(fVar21) + ABS(fVar20);
        if (bVar13) {
LAB_00154f01:
          fVar26 = fVar27;
          uVar17 = (uint)(0.0 < fVar24);
          fVar21 = fVar24;
          fVar20 = fVar25;
          if (ABS(fVar24) <= ABS(fVar25)) {
            uVar17 = 0.0 < fVar25 | 2;
          }
        }
        else {
          if ((fVar24 != 0.0) || (NAN(fVar24))) goto LAB_00154f01;
          if ((((fVar21 != 0.0) || (NAN(fVar21))) || (fVar20 != 0.0)) || (NAN(fVar20))) {
            fVar26 = fVar28;
            uVar17 = 0.0 < fVar20 | 2;
            if (ABS(fVar20) < ABS(fVar21)) {
              uVar17 = (uint)(0.0 < fVar21);
            }
          }
          else {
            fVar26 = 0.0;
            uVar17 = (uint)(pIVar12->NavId <= (pIVar9->DC).LastItemId);
            fVar21 = 0.0;
            fVar20 = 0.0;
          }
        }
        fVar5 = *(float *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x2c);
        if (uVar17 != uVar6) goto LAB_00154fb2;
        if (fVar5 <= fVar27) {
          if ((fVar27 != fVar5) || (NAN(fVar27) || NAN(fVar5))) {
LAB_00154fb2:
            bVar13 = false;
          }
          else {
            fVar27 = *(float *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x28);
            if (fVar27 <= fVar28) {
              if ((fVar28 == fVar27) && (!NAN(fVar28) && !NAN(fVar27))) {
                if ((uVar6 & 0xfffffffe) != 2) {
                  fVar25 = fVar24;
                }
                if (fVar25 < 0.0) goto LAB_00154fad;
              }
              goto LAB_00154fb2;
            }
            *(float *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x28) = fVar28;
LAB_00154fad:
            bVar13 = true;
          }
          if (((((fVar5 != 3.4028235e+38) || (NAN(fVar5))) || (iVar7 != 1)) ||
              ((*(float *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x24) <= fVar26 ||
               ((pIVar12->NavWindow->Flags & 0x10000000) != 0)))) ||
             (((((uVar6 != 0 || (0.0 <= fVar21)) && ((uVar6 != 1 || (fVar21 <= 0.0)))) &&
               ((uVar6 != 2 || (0.0 <= fVar20)))) && ((uVar6 != 3 || (fVar20 <= 0.0)))))) {
            if (!bVar13) goto LAB_00155052;
          }
          else {
            *(float *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x24) = fVar26;
          }
        }
        else {
          *(ulong *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x2c) = CONCAT44(fVar28,fVar27);
        }
        *(ImGuiID *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x3c) = id;
        pvVar16 = ImVector<unsigned_int>::back(&pIVar8->IDStack);
        *(value_type_conflict3 *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x38) = *pvVar16;
        *(ImGuiWindow **)((long)(pIVar11->IO).KeyMap + lVar19 + -0x34) = pIVar8;
        pfVar3 = (float *)((long)(pIVar11->IO).KeyMap + lVar19 + -0x20);
        *pfVar3 = fVar31;
        pfVar3[1] = fVar32;
        pfVar3[2] = fVar22;
        pfVar3[3] = fVar23;
        IVar15 = pIVar11->NavId;
      }
    }
  }
LAB_00155052:
  if (IVar15 == id) {
    pIVar11->NavWindow = pIVar8;
    iVar7 = (pIVar8->DC).NavLayerCurrent;
    pIVar11->NavLayer = iVar7;
    pIVar11->NavIdIsAlive = true;
    pIVar11->NavIdTabCounter = pIVar8->FocusIdxTabCounter;
    pIVar4 = pIVar8->NavRectRel + iVar7;
    (pIVar4->Min).x = fVar31;
    (pIVar4->Min).y = fVar32;
    (pIVar4->Max).x = fVar22;
    (pIVar4->Max).y = fVar23;
  }
LAB_00154b54:
  (pIVar8->DC).LastItemId = id;
  IVar10 = bb->Max;
  (pIVar8->DC).LastItemRect.Min = bb->Min;
  (pIVar8->DC).LastItemRect.Max = IVar10;
  (pIVar8->DC).LastItemStatusFlags = 0;
  bVar13 = IsClippedEx(bb,id,false);
  if ((!bVar13) && (bVar14 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar14)) {
    pIVar2 = &(pIVar8->DC).LastItemStatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar13;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window. 
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = 0;

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}